

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatfile_tests.cpp
# Opt level: O0

void __thiscall flatfile_tests::flatfile_filename::test_method(flatfile_filename *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  FlatFilePos pos;
  FlatFileSeq seq2;
  FlatFileSeq seq1;
  path data_dir;
  char *in_stack_fffffffffffffca8;
  ArgsManager *in_stack_fffffffffffffcb0;
  char *in_stack_fffffffffffffcb8;
  path *in_stack_fffffffffffffcc0;
  const_string *in_stack_fffffffffffffcd0;
  undefined6 in_stack_fffffffffffffcd8;
  undefined1 in_stack_fffffffffffffcde;
  undefined1 in_stack_fffffffffffffcdf;
  FlatFileSeq *in_stack_fffffffffffffce0;
  FlatFileSeq *in_stack_fffffffffffffce8;
  unit_test_log_t *this_00;
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [64];
  undefined1 local_288 [16];
  undefined1 local_278 [152];
  undefined1 local_1e0 [296];
  undefined1 local_b8 [176];
  size_type local_8;
  
  local_8 = *(size_type *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDirBase(in_stack_fffffffffffffcb0);
  FlatFilePos::FlatFilePos((FlatFilePos *)in_stack_fffffffffffffca8,0,0x665b61);
  fs::path::path((path *)in_stack_fffffffffffffca8,(path *)0x665b78);
  FlatFileSeq::FlatFileSeq
            (in_stack_fffffffffffffce8,&in_stack_fffffffffffffce0->m_dir,
             (char *)CONCAT17(in_stack_fffffffffffffcdf,
                              CONCAT16(in_stack_fffffffffffffcde,in_stack_fffffffffffffcd8)),
             (size_t)in_stack_fffffffffffffcd0);
  fs::path::~path((path *)in_stack_fffffffffffffca8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffcb8,
               (pointer)in_stack_fffffffffffffcb0,(unsigned_long)in_stack_fffffffffffffca8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffca8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffce8,
               (const_string *)in_stack_fffffffffffffce0,
               CONCAT17(in_stack_fffffffffffffcdf,
                        CONCAT16(in_stack_fffffffffffffcde,in_stack_fffffffffffffcd8)),
               in_stack_fffffffffffffcd0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffcb0,(char (*) [1])in_stack_fffffffffffffca8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffcb8,
               (pointer)in_stack_fffffffffffffcb0,(unsigned_long)in_stack_fffffffffffffca8);
    FlatFileSeq::FileName
              (in_stack_fffffffffffffce0,
               (FlatFilePos *)
               CONCAT17(in_stack_fffffffffffffcdf,
                        CONCAT16(in_stack_fffffffffffffcde,in_stack_fffffffffffffcd8)));
    fs::path::path((path *)in_stack_fffffffffffffca8,(path *)0x665c77);
    fs::operator/(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
    in_stack_fffffffffffffcb8 = "data_dir / \"a00456.dat\"";
    in_stack_fffffffffffffcb0 = (ArgsManager *)(local_1e0 + 0x100);
    in_stack_fffffffffffffca8 = "seq1.FileName(pos)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
              (local_278,local_288,0x16,1,2,local_b8);
    fs::path::~path((path *)in_stack_fffffffffffffca8);
    fs::path::~path((path *)in_stack_fffffffffffffca8);
    fs::path::~path((path *)in_stack_fffffffffffffca8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffca8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  fs::path::path((path *)in_stack_fffffffffffffca8,(path *)0x665d4c);
  fs::operator/(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  FlatFileSeq::FlatFileSeq
            (in_stack_fffffffffffffce8,&in_stack_fffffffffffffce0->m_dir,
             (char *)CONCAT17(in_stack_fffffffffffffcdf,
                              CONCAT16(in_stack_fffffffffffffcde,in_stack_fffffffffffffcd8)),
             (size_t)in_stack_fffffffffffffcd0);
  fs::path::~path((path *)in_stack_fffffffffffffca8);
  fs::path::~path((path *)in_stack_fffffffffffffca8);
  do {
    this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffcb8,
               (pointer)in_stack_fffffffffffffcb0,(unsigned_long)in_stack_fffffffffffffca8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffca8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_00,(const_string *)in_stack_fffffffffffffce0,
               CONCAT17(in_stack_fffffffffffffcdf,
                        CONCAT16(in_stack_fffffffffffffcde,in_stack_fffffffffffffcd8)),
               in_stack_fffffffffffffcd0);
    in_stack_fffffffffffffce0 = (FlatFileSeq *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffcb0,(char (*) [1])in_stack_fffffffffffffca8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffcb8,
               (pointer)in_stack_fffffffffffffcb0,(unsigned_long)in_stack_fffffffffffffca8);
    FlatFileSeq::FileName
              (in_stack_fffffffffffffce0,
               (FlatFilePos *)
               CONCAT17(in_stack_fffffffffffffcdf,
                        CONCAT16(in_stack_fffffffffffffcde,in_stack_fffffffffffffcd8)));
    fs::path::path((path *)in_stack_fffffffffffffca8,(path *)0x665e76);
    fs::operator/(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
    fs::operator/(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
    in_stack_fffffffffffffcb8 = "data_dir / \"a\" / \"b00456.dat\"";
    in_stack_fffffffffffffcb0 = (ArgsManager *)local_1e0;
    in_stack_fffffffffffffca8 = "seq2.FileName(pos)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
              (local_2c8,local_2d8,0x19,1,2,local_1e0 + 0x28);
    fs::path::~path((path *)in_stack_fffffffffffffca8);
    fs::path::~path((path *)in_stack_fffffffffffffca8);
    fs::path::~path((path *)in_stack_fffffffffffffca8);
    fs::path::~path((path *)in_stack_fffffffffffffca8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffca8);
    in_stack_fffffffffffffcdf = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffcdf);
  FlatFilePos::FlatFilePos((FlatFilePos *)in_stack_fffffffffffffca8);
  bVar1 = FlatFilePos::IsNull((FlatFilePos *)in_stack_fffffffffffffca8);
  if (!bVar1) {
    __assert_fail("FlatFilePos{}.IsNull()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/flatfile_tests.cpp"
                  ,0x1c,"void flatfile_tests::flatfile_filename::test_method()");
  }
  FlatFileSeq::~FlatFileSeq((FlatFileSeq *)in_stack_fffffffffffffca8);
  FlatFileSeq::~FlatFileSeq((FlatFileSeq *)in_stack_fffffffffffffca8);
  fs::path::~path((path *)in_stack_fffffffffffffca8);
  if (*(size_type *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(flatfile_filename)
{
    const auto data_dir = m_args.GetDataDirBase();

    FlatFilePos pos(456, 789);

    FlatFileSeq seq1(data_dir, "a", 16 * 1024);
    BOOST_CHECK_EQUAL(seq1.FileName(pos), data_dir / "a00456.dat");

    FlatFileSeq seq2(data_dir / "a", "b", 16 * 1024);
    BOOST_CHECK_EQUAL(seq2.FileName(pos), data_dir / "a" / "b00456.dat");

    // Check default constructor IsNull
    assert(FlatFilePos{}.IsNull());
}